

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O2

void __thiscall Clasp::ClaspStatistics::Impl::~Impl(Impl *this)

{
  __node_base *p_Var1;
  _Node_iterator_base<unsigned_long,_false> it;
  
  p_Var1 = &(this->strings_)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    if (p_Var1[1]._M_nxt != (_Hash_node_base *)0x0) {
      operator_delete__(p_Var1[1]._M_nxt);
    }
  }
  it._M_cur = (__node_type *)&(this->objects_)._M_h._M_before_begin;
  while (it._M_cur = (__node_type *)((it._M_cur)->super__Hash_node_base)._M_nxt,
        it._M_cur != (__node_type *)0x0) {
    destroyIfWritable(this,(iterator)it._M_cur);
  }
  std::
  _Hashtable<const_char_*,_const_char_*,_std::allocator<const_char_*>,_std::__detail::_Identity,_Clasp::StrEq,_Clasp::StrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&(this->strings_)._M_h);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)this);
  return;
}

Assistant:

~Impl() {
		for (StringSet::iterator it = strings_.begin(), end = strings_.end(); it != end; ++it) {
			delete[] *it;
		}
		for (KeySet::iterator it = objects_.begin(), end = objects_.end(); it != end; ++it) {
			destroyIfWritable(it);
		}
	}